

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word Gia_LutComputeTruth6(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTruths)

{
  int iVar1;
  int *piVar2;
  word wVar3;
  int local_24;
  int iFan;
  int k;
  Vec_Wrd_t *vTruths_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsLut(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x111,"word Gia_LutComputeTruth6(Gia_Man_t *, int, Vec_Wrd_t *)");
  }
  Gia_ManIncrementTravId(p);
  for (local_24 = 0; iVar1 = Gia_ObjLutSize(p,iObj), local_24 < iVar1; local_24 = local_24 + 1) {
    piVar2 = Gia_ObjLutFanins(p,iObj);
    iVar1 = piVar2[local_24];
    Vec_WrdWriteEntry(vTruths,iVar1,s_Truths6[local_24]);
    Gia_ObjSetTravIdCurrentId(p,iVar1);
  }
  wVar3 = Gia_LutComputeTruth6_rec(p,iObj,vTruths);
  return wVar3;
}

Assistant:

word Gia_LutComputeTruth6( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTruths )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        Vec_WrdWriteEntry( vTruths, iFan, s_Truths6[k] );
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    return Gia_LutComputeTruth6_rec( p, iObj, vTruths );
}